

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int * __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::operator[](HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
             *this,int *key)

{
  bool bVar1;
  size_t index;
  const_reference this_00;
  pair<int,_int> *ppVar2;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_RDI;
  size_t offset;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  
  index = FindOffset(this,key);
  this_00 = pstd::
            vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
            ::operator[](in_RDI,index);
  bVar1 = pstd::optional<std::pair<int,_int>_>::has_value(this_00);
  if (!bVar1) {
    LogFatal<char_const(&)[26]>
              (in_stack_00000044,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               (char (*) [26])this);
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::operator[](in_RDI,index);
  ppVar2 = pstd::optional<std::pair<int,_int>_>::operator->
                     ((optional<std::pair<int,_int>_> *)0x5a5a9d);
  return &ppVar2->second;
}

Assistant:

PBRT_CPU_GPU
    const Value &operator[](const Key &key) const {
        size_t offset = FindOffset(key);
        CHECK(table[offset].has_value());
        return table[offset]->second;
    }